

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

void solver_rebuild_order(solver_t *s)

{
  heap_t *p;
  vec_int_t *p_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint x;
  uint y;
  int iVar4;
  vec_uint_t *p_01;
  uint idx;
  uint uVar5;
  vec_uint_t *pvVar6;
  uint uVar7;
  
  p_01 = vec_uint_alloc(s->assigns->size);
  for (uVar5 = 0; uVar5 < s->assigns->size; uVar5 = uVar5 + 1) {
    cVar1 = var_value(s,uVar5);
    if (cVar1 == '\x03') {
      vec_uint_push_back(p_01,uVar5);
    }
  }
  p = s->var_order;
  for (uVar5 = 0; pvVar6 = p->data, uVar5 < pvVar6->size; uVar5 = uVar5 + 1) {
    uVar2 = vec_uint_at(pvVar6,uVar5);
    vec_int_assign(p->indices,uVar2,-1);
  }
  pvVar6->size = 0;
  uVar5 = p_01->size;
  for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = vec_uint_at(p_01,uVar2);
    vec_int_assign(p->indices,uVar3,uVar2);
    vec_uint_push_back(p->data,uVar3);
  }
  uVar5 = p->data->size >> 1;
  do {
    if ((int)uVar5 < 1) {
      vec_uint_free(p_01);
      return;
    }
    uVar5 = uVar5 - 1;
    uVar3 = vec_uint_at(p->data,uVar5);
    uVar2 = uVar5;
    while( true ) {
      uVar7 = uVar2 * 2 + 1;
      pvVar6 = p->data;
      if (pvVar6->size <= uVar7) break;
      idx = uVar2 * 2 + 2;
      if (idx < pvVar6->size) {
        x = vec_uint_at(pvVar6,idx);
        y = vec_uint_at(p->data,uVar7);
        iVar4 = compare(p,x,y);
        if (iVar4 == 0) goto LAB_0046c9d9;
      }
      else {
LAB_0046c9d9:
        idx = uVar7;
      }
      uVar7 = vec_uint_at(p->data,idx);
      iVar4 = compare(p,uVar7,uVar3);
      pvVar6 = p->data;
      if (iVar4 == 0) break;
      uVar7 = vec_uint_at(pvVar6,idx);
      vec_uint_assign(pvVar6,uVar2,uVar7);
      p_00 = p->indices;
      uVar7 = vec_uint_at(p->data,uVar2);
      vec_int_assign(p_00,uVar7,uVar2);
      uVar2 = idx;
    }
    vec_uint_assign(pvVar6,uVar2,uVar3);
    vec_int_assign(p->indices,uVar3,uVar2);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

//===------------------------------------------------------------------------===
// Satoko internal functions
//===------------------------------------------------------------------------===
static inline void solver_rebuild_order(solver_t *s)
{
    unsigned var;
    vec_uint_t *vars = vec_uint_alloc(vec_char_size(s->assigns));

    for (var = 0; var < vec_char_size(s->assigns); var++)
        if (var_value(s, var) == SATOKO_VAR_UNASSING)
            vec_uint_push_back(vars, var);
    heap_build(s->var_order, vars);
    vec_uint_free(vars);
}